

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

void __thiscall
diligent_spirv_cross::SmallVector<diligent_spirv_cross::SPIRConstant_*,_0UL>::SmallVector
          (SmallVector<diligent_spirv_cross::SPIRConstant_*,_0UL> *this)

{
  SPIRConstant **ppSVar1;
  SmallVector<diligent_spirv_cross::SPIRConstant_*,_0UL> *this_local;
  
  VectorView<diligent_spirv_cross::SPIRConstant_*>::VectorView
            (&this->super_VectorView<diligent_spirv_cross::SPIRConstant_*>);
  this->buffer_capacity = 0;
  ppSVar1 = AlignedBuffer<diligent_spirv_cross::SPIRConstant_*,_0UL>::data
                      ((AlignedBuffer<diligent_spirv_cross::SPIRConstant_*,_0UL> *)&this->field_0x18
                      );
  (this->super_VectorView<diligent_spirv_cross::SPIRConstant_*>).ptr = ppSVar1;
  this->buffer_capacity = 0;
  return;
}

Assistant:

SmallVector() SPIRV_CROSS_NOEXCEPT
	{
		this->ptr = stack_storage.data();
		buffer_capacity = N;
	}